

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Im<(moira::Mode)11,_2> wrapper)

{
  if ((this->style->syntax & ~MOIRA_MIT) == GNU) {
    operator<<(this,(Ims<2>)(wrapper.ea)->ext1);
  }
  else {
    operator<<(this,(Imu<2>)(wrapper.ea)->ext1);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Im<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            *this << Ims<S>(ea.ext1);
            break;

        default:

            *this << Imu<S>(ea.ext1);
            break;
    }

    return *this;
}